

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O1

void __thiscall RandStrRepeat::generate(RandStrRepeat *this,wchar_t **dst)

{
  RandStrNode *pRVar1;
  uint32_t uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  bool bVar9;
  
  if (this->hi < 0) {
    if (0 < this->lo) {
      iVar4 = 0;
      do {
        pRVar1 = (this->super_RandStrNode).firstChild;
        (*pRVar1->_vptr_RandStrNode[3])(pRVar1,dst);
        iVar4 = iVar4 + 1;
      } while (iVar4 < this->lo);
    }
    uVar2 = rng_next();
    uVar3 = (uVar2 >> 0x10) * 100;
    if ((((uVar2 & 0xffff) * 100 >> 0x10) + (uVar3 & 0xffff) >> 0x10) + (uVar3 >> 0x10) < 0x43) {
      uVar3 = 0;
      do {
        pRVar1 = (this->super_RandStrNode).firstChild;
        (*pRVar1->_vptr_RandStrNode[3])(pRVar1,dst);
        uVar2 = rng_next();
        uVar5 = (uVar2 >> 0x10) * 100;
        if (0x42 < (((uVar2 & 0xffff) * 100 >> 0x10) + (uVar5 & 0xffff) >> 0x10) + (uVar5 >> 0x10))
        {
          return;
        }
        bVar9 = uVar3 < 0x31;
        uVar3 = uVar3 + 1;
      } while (bVar9);
    }
  }
  else {
    uVar2 = rng_next();
    uVar3 = (this->hi - this->lo) + 1;
    uVar6 = uVar3 >> 0x10;
    uVar3 = uVar3 & 0xffff;
    uVar5 = (uVar2 >> 0x10) * uVar3;
    uVar7 = uVar6 * (uVar2 & 0xffff);
    lVar8 = (ulong)uVar6 * (ulong)(uVar2 >> 0x10) + (long)this->lo + (ulong)(uVar5 >> 0x10) +
            (ulong)(uVar7 >> 0x10) +
            (ulong)(((uVar2 & 0xffff) * uVar3 >> 0x10) + (uVar5 & 0xffff) + (uVar7 & 0xffff) >> 0x10
                   );
    if (lVar8 != 0) {
      lVar8 = -lVar8;
      do {
        pRVar1 = (this->super_RandStrNode).firstChild;
        (*pRVar1->_vptr_RandStrNode[3])(pRVar1,dst);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0);
    }
  }
  return;
}

Assistant:

virtual void generate(VMG_ wchar_t *&dst)
    {
        if (hi >= 0)
        {
            /* 
             *   Finite upper bound.  Pick a random repeat count from lo to
             *   hi, and generate our child that many times.  
             */
            for (ulong cnt = rand_range(rng_next(vmg0_), lo, hi) ;
                 cnt != 0 ; --cnt)
                firstChild->generate(vmg_ dst);
        }
        else
        {
            /* no upper bound - start with the fixed lower bound */
            int i;
            for (i = 0 ; i < lo ; ++i)
                firstChild->generate(vmg_ dst);

            /* 
             *   Now add additional items one at a time, with 67% probability
             *   for each added item.  Stop when we fail the roll.  
             */
            for (i = 0 ;
                 rand_range(rng_next(vmg0_), 0, 99) < 67 && i < MAX_UNBOUNDED ;
                 ++i)
                firstChild->generate(vmg_ dst);
        }
    }